

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool TestHashList<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  double dVar7;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  HashSet<unsigned_int> collisions;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  bVar1 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    dVar7 = EstimateNbCollisions
                      ((int)((ulong)((long)(hashes->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(hashes->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 2),0x20);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",0x20);
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_left =
         &collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_node_count = 0;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_right =
         collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>.
         _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar5 = FindCollisions<unsigned_int>(hashes,&collisions,1000);
    printf("actual %6i (%.2fx)",(ulong)uVar5);
    bVar1 = (double)(int)uVar5 / dVar7 <= 2.0;
    if (!bVar1) {
      printf(" !!!!!");
    }
    putchar(10);
    if (testHighBits) {
      bVar1 = TestHighbitsCollisions<unsigned_int>(hashes);
      bVar2 = CountHighbitsCollisions<unsigned_int>(hashes,0xc);
      bVar3 = CountHighbitsCollisions<unsigned_int>(hashes,8);
      bVar1 = ((bVar1 && bVar2) && bVar3) && (double)(int)uVar5 / dVar7 <= 2.0;
    }
    if (testLowBits) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,hashes);
      for (uVar6 = 0;
          uVar6 < (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar6 = uVar6 + 1) {
        uVar5 = bitreverse<unsigned_int>
                          (local_98._M_impl.super__Vector_impl_data._M_start[uVar6],0x20);
        local_98._M_impl.super__Vector_impl_data._M_start[uVar6] = uVar5;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      bVar2 = TestLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98);
      bVar3 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,0xc);
      bVar4 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,8);
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
      bVar1 = (bool)((bVar3 && bVar4) & bVar1 & bVar2);
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_98._M_impl.super__Vector_impl_data._M_start;
      local_48._M_impl.super__Vector_impl_data._M_finish =
           local_98._M_impl.super__Vector_impl_data._M_finish;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&collisions);
  }
  if (testDist) {
    bVar2 = TestDistribution<unsigned_int>(hashes,drawDiagram);
    bVar1 = bVar1 != false && bVar2;
  }
  return bVar1;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if(testCollision)
  {
    size_t count = hashes.size();
    double expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if(double(collcount) / double(expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 256);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);
      result &= CountHighbitsCollisions(hashes,   12);
      result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(revhashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      result &= CountLowbitsCollisions(revhashes,   12);
      result &= CountLowbitsCollisions(revhashes,   8);

      std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}